

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O3

void Txs3_ManCollectCone_rec(Txs3_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t **ppVVar5;
  
  if (pObj->Value == 0xffffffff) {
    return;
  }
  pObj->Value = 0xffffffff;
  uVar3 = (uint)*(undefined8 *)pObj;
  if ((~uVar3 & 0x9fffffff) == 0) {
    pGVar2 = p->pGia;
    uVar3 = (uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff;
    iVar1 = pGVar2->vCis->nSize;
    if ((int)uVar3 < iVar1 - pGVar2->nRegs) {
      pGVar4 = pGVar2->pObjs;
      if ((pObj < pGVar4) || (pGVar4 + pGVar2->nObjs <= pObj)) goto LAB_005fe3ba;
      ppVVar5 = &p->vCiObjs;
    }
    else {
      uVar3 = (pGVar2->nRegs - iVar1) + uVar3;
      if (((int)uVar3 < 0) || (p->vPrio->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pGVar4 = pGVar2->pObjs;
      if (p->vPrio->pArray[uVar3] == 0) {
        if ((pObj < pGVar4) || (pGVar4 + pGVar2->nObjs <= pObj)) goto LAB_005fe3ba;
        ppVVar5 = &p->vFosAbs;
      }
      else {
        if ((pObj < pGVar4) || (pGVar4 + pGVar2->nObjs <= pObj)) {
LAB_005fe3ba:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        ppVVar5 = &p->vFosPre;
      }
    }
  }
  else {
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim3.c"
                    ,0x87,"void Txs3_ManCollectCone_rec(Txs3_Man_t *, Gia_Obj_t *)");
    }
    Txs3_ManCollectCone_rec(p,pObj + -(ulong)(uVar3 & 0x1fffffff));
    Txs3_ManCollectCone_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    pGVar4 = p->pGia->pObjs;
    if ((pObj < pGVar4) || (pGVar4 + p->pGia->nObjs <= pObj)) goto LAB_005fe3ba;
    ppVVar5 = &p->vNodes;
  }
  Vec_IntPush(*ppVVar5,(int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555);
  return;
}

Assistant:

void Txs3_ManCollectCone_rec( Txs3_Man_t * p, Gia_Obj_t * pObj )
{
    if ( !~pObj->Value )
        return;
    pObj->Value = ~0;
    if ( Gia_ObjIsCi(pObj) )
    {
        int Entry;
        if ( Gia_ObjIsPi(p->pGia, pObj) )
        {
            Vec_IntPush( p->vCiObjs, Gia_ObjId(p->pGia, pObj) );
            return;
        }
        Entry = Gia_ObjCioId(pObj) - Gia_ManPiNum(p->pGia);
        if ( Vec_IntEntry(p->vPrio, Entry) ) // present flop
            Vec_IntPush( p->vFosPre, Gia_ObjId(p->pGia, pObj) );
        else // asbstracted flop
            Vec_IntPush( p->vFosAbs, Gia_ObjId(p->pGia, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Txs3_ManCollectCone_rec( p, Gia_ObjFanin0(pObj) );
    Txs3_ManCollectCone_rec( p, Gia_ObjFanin1(pObj) );
    Vec_IntPush( p->vNodes, Gia_ObjId(p->pGia, pObj) );
}